

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *
expectedValues<libcellml::Issue::Level>
          (vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
           *__return_storage_ptr__,size_t size,Level value)

{
  Level local_1c;
  size_t sStack_18;
  Level value_local;
  size_t size_local;
  vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *res;
  
  local_1c = value;
  sStack_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::vector
            (__return_storage_ptr__);
  std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::assign
            (__return_storage_ptr__,sStack_18,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> expectedValues(size_t size, T value)
{
    std::vector<T> res;

    res.assign(size, value);

    return res;
}